

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBrBReturn(Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool isHelper)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  RegOpnd *opndArg;
  Instr *pIVar5;
  HelperCallOpnd *src1Opnd;
  Instr *pIVar6;
  BranchInstr *pBVar7;
  OpCode OVar8;
  Instr *local_50;
  Instr *loweredInstr;
  RegOpnd *forInEnumeratorRegOpnd;
  Opnd *opndDst;
  HelperCallOpnd *opndHelper;
  Instr *instrCall;
  Instr *instrPrev;
  bool isHelper_local;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(instr);
  if ((pOVar3 == (Opnd *)0x0) || (pOVar3 = IR::Instr::GetSrc2(instr), pOVar3 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2771,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnds on BrB");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((instr->m_opcode != BrOnEmpty) && (instr->m_opcode != BrOnNotEmpty)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2772,
                       "(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar3 = IR::Instr::UnlinkSrc1(instr);
  opndArg = GenerateForInEnumeratorLoad(this,pOVar3,instr);
  pIVar5 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  pOVar3 = IR::Instr::UnlinkDst(instr);
  pIVar6 = IR::Instr::New(Call,pOVar3,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar6);
  pIVar6 = LowererMD::LowerCall(&this->m_lowererMD,pIVar6,0);
  OVar8 = BrFalse_A;
  if (instr->m_opcode == BrOnNotEmpty) {
    OVar8 = BrTrue_A;
  }
  instr->m_opcode = OVar8;
  IR::Instr::SetSrc1(instr,pOVar3);
  pBVar7 = IR::Instr::AsBranchInstr(instr);
  local_50 = LowerCondBranchCheckBailOut(this,pBVar7,pIVar6,isHelper);
  if (isHelper) {
    bVar2 = IR::Instr::IsBranchInstr(local_50);
    if (!bVar2) {
      local_50 = IR::Instr::GetNextBranchOrLabel(local_50);
    }
    bVar2 = IR::Instr::IsBranchInstr(local_50);
    if (bVar2) {
      pBVar7 = IR::Instr::AsBranchInstr(local_50);
      pBVar7->m_isHelperToNonHelperBranch = true;
    }
  }
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerBrBReturn(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool isHelper)
{
    IR::Instr * instrPrev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndDst;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnds on BrB");
    Assert(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty);
    IR::RegOpnd * forInEnumeratorRegOpnd = GenerateForInEnumeratorLoad(instr->UnlinkSrc1(), instr);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, forInEnumeratorRegOpnd);

    // Generate helper call to convert the unknown operand to boolean

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);

    opndDst = instr->UnlinkDst();
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    // Branch on the result of the call
    instr->m_opcode = (instr->m_opcode == Js::OpCode::BrOnNotEmpty? Js::OpCode::BrTrue_A : Js::OpCode::BrFalse_A);
    instr->SetSrc1(opndDst);
    IR::Instr *loweredInstr;
    loweredInstr = this->LowerCondBranchCheckBailOut(instr->AsBranchInstr(), instrCall, isHelper);

#if DBG
    if (isHelper)
    {
        if (!loweredInstr->IsBranchInstr())
        {
            loweredInstr = loweredInstr->GetNextBranchOrLabel();
        }
        if (loweredInstr->IsBranchInstr())
        {
            loweredInstr->AsBranchInstr()->m_isHelperToNonHelperBranch = true;
        }
    }
#endif
    return instrPrev;
}